

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

Error * stick::fs::copyFile(Error *__return_storage_ptr__,String *_from,String *_to)

{
  SystemErrorCode SVar1;
  bool bVar2;
  int __fd;
  int __fd_00;
  SystemErrorCode *pSVar3;
  Allocator *pAVar4;
  size_t __n;
  ssize_t sVar5;
  int *piVar6;
  undefined1 *__buf;
  undefined1 local_10b8 [8];
  char buffer [4096];
  String local_b0;
  Error local_90;
  Error *local_38;
  
  local_38 = __return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  __fd = open(_from->m_cStr,0);
  if (__fd == -1) {
    pSVar3 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar3;
    pAVar4 = defaultAllocator();
    String::String((String *)&local_90,"",pAVar4);
    Error::Error<stick::ec::SystemErrorCode>
              ((Error *)local_10b8,SVar1,(String *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1c9,(type *)0x0);
    Error::operator=(local_38,(Error *)local_10b8);
    Error::~Error((Error *)local_10b8);
    String::deallocate((String *)&local_90);
  }
  __fd_00 = open(_to->m_cStr,0xc1,0x1b6);
  if (__fd_00 == -1) {
    pSVar3 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar3;
    pAVar4 = defaultAllocator();
    String::String((String *)&local_90,"",pAVar4);
    Error::Error<stick::ec::SystemErrorCode>
              ((Error *)local_10b8,SVar1,(String *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1cf,(type *)0x0);
    Error::operator=(local_38,(Error *)local_10b8);
    Error::~Error((Error *)local_10b8);
    String::deallocate((String *)&local_90);
    close(__fd);
  }
  bVar2 = false;
LAB_0011003e:
  do {
    __n = read(__fd,local_10b8,0x1000);
    if ((__n == 0) || (__buf = local_10b8, bVar2)) {
      if (bVar2) {
        pSVar3 = (SystemErrorCode *)__errno_location();
        SVar1 = *pSVar3;
        pAVar4 = defaultAllocator();
        String::String(&local_b0,"",pAVar4);
        Error::Error<stick::ec::SystemErrorCode>
                  (&local_90,SVar1,&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
                   ,0x1eb,(type *)0x0);
        Error::operator=(local_38,&local_90);
        Error::~Error(&local_90);
        String::deallocate(&local_b0);
      }
      close(__fd);
      close(__fd_00);
      return local_38;
    }
    do {
      sVar5 = write(__fd_00,__buf,__n);
      if (sVar5 < 0) {
        piVar6 = __errno_location();
        if (*piVar6 != 4) {
          bVar2 = true;
          goto LAB_0011003e;
        }
      }
      else {
        __n = __n - sVar5;
        __buf = __buf + sVar5;
      }
    } while (__n != 0);
    bVar2 = false;
  } while( true );
}

Assistant:

Error copyFile(const String & _from, const String & _to)
{
    Error ret;
    int fdFrom, fdTo;
    char buffer[4096];
    Size numBytesRead;

    fdFrom = open(_from.cString(), O_RDONLY);
    if (fdFrom == -1)
    {
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);
    }

    fdTo = open(_to.cString(), O_WRONLY | O_CREAT | O_EXCL, 0666);
    if (fdTo == -1)
    {
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);
        close(fdFrom);
    }

    bool bBreak = false;
    while (numBytesRead = read(fdFrom, buffer, sizeof(buffer)), numBytesRead > 0 && !bBreak)
    {
        char * outPtr = buffer;
        Int64 numBytesWritten;
        do
        {
            numBytesWritten = write(fdTo, outPtr, numBytesRead);

            if (numBytesWritten >= 0)
            {
                numBytesRead -= numBytesWritten;
                outPtr += numBytesWritten;
            }
            else if (errno != EINTR)
            {
                bBreak = true;
                break;
            }
        } while (numBytesRead > 0);
    }

    // error, retrieve it
    if (bBreak)
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);

    close(fdFrom);
    close(fdTo);

    return ret;
}